

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChTriangleMeshConnected::ChTriangleMeshConnected
          (ChTriangleMeshConnected *this,ChTriangleMeshConnected *source)

{
  (this->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
  (this->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->m_vertices,&source->m_vertices);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->m_normals,&source->m_normals);
  std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::operator=
            (&this->m_UV,&source->m_UV);
  std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::operator=
            (&this->m_colors,&source->m_colors);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&this->m_face_v_indices,&source->m_face_v_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&this->m_face_n_indices,&source->m_face_n_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&this->m_face_uv_indices,&source->m_face_uv_indices);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (&this->m_face_col_indices,&source->m_face_col_indices);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->m_face_mat_indices,&source->m_face_mat_indices);
  std::__cxx11::string::_M_assign((string *)&this->m_filename);
  return;
}

Assistant:

ChTriangleMeshConnected::ChTriangleMeshConnected(const ChTriangleMeshConnected& source) {
    m_vertices = source.m_vertices;
    m_normals = source.m_normals;
    m_UV = source.m_UV;
    m_colors = source.m_colors;

    m_face_v_indices = source.m_face_v_indices;
    m_face_n_indices = source.m_face_n_indices;
    m_face_uv_indices = source.m_face_uv_indices;
    m_face_col_indices = source.m_face_col_indices;
    m_face_mat_indices = source.m_face_mat_indices;

    m_filename = source.m_filename;
}